

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint32_t __thiscall doublechecked::Roaring::minimum(Roaring *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference puVar3;
  Roaring *in_RDI;
  uint32_t ans;
  undefined4 in_stack_ffffffffffffffdc;
  int line;
  iterator in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t uVar4;
  
  uVar2 = roaring::Roaring::minimum(in_RDI);
  bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x10f73a);
  if (bVar1) {
    line = CONCAT13(uVar2 == 0xffffffff,(int3)in_stack_ffffffffffffffdc);
  }
  else {
    uVar4 = uVar2;
    in_stack_ffffffffffffffe8 =
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x10f772);
    line = CONCAT13(uVar2 == *puVar3,(int3)in_stack_ffffffffffffffdc);
    uVar2 = uVar4;
  }
  _assert_true(CONCAT44(uVar2,in_stack_fffffffffffffff0),(char *)in_stack_ffffffffffffffe8._M_node,
               (char *)in_RDI,line);
  return uVar2;
}

Assistant:

uint32_t minimum() const {
        uint32_t ans = plain.minimum();
        assert_true(check.empty() ? ans == UINT32_MAX : ans == *check.begin());
        return ans;
    }